

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shaft.h
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::Shaft::Shaft(Shaft *this,Shaft *param_1)

{
  KINT16 KVar1;
  KINT32 KVar2;
  Shaft *param_1_local;
  Shaft *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__Shaft_00330918;
  KVar1 = param_1->m_i16OrderedRPM;
  KVar2 = param_1->m_i32RPMRateOfChange;
  this->m_i16CurrentRPM = param_1->m_i16CurrentRPM;
  this->m_i16OrderedRPM = KVar1;
  this->m_i32RPMRateOfChange = KVar2;
  return;
}

Assistant:

class KDIS_EXPORT Shaft : public DataTypeBase
{
protected:

    KINT16 m_i16CurrentRPM;

    KINT16 m_i16OrderedRPM;

    KINT32 m_i32RPMRateOfChange;

public:

    static const KUINT16 SHAFT_SIZE = 8;

    Shaft();

    Shaft(KDataStream &stream) noexcept(false);

    Shaft( KINT16 CurrentRPM, KINT16 OrderedRPM, KINT32 RateOfChange );

    virtual ~Shaft();

    //************************************
    // FullName:    KDIS::DATA_TYPE::Shaft::SetCurrentRPM
    //              KDIS::DATA_TYPE::Shaft::GetCurrentRPM
    // Description: Current speed in RPM of the shaft.
    //              A positive value indicates a clockwise
    //              rotation. Shafts are defined from port to
    //              starboard locations(refrence view is from stern to bow).
    // Parameter:   KINT16 RPM, void
    //************************************
    void SetCurrentRPM( KINT16 RPM );
    KINT16 GetCurrentRPM() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Shaft::SetOrderedRPM
    //              KDIS::DATA_TYPE::Shaft::GetOrderedRPM
    // Description: Current speed in RPM of the shaft.
    //              A positive value indicates a clockwise
    //              rotation. Shafts are defined from port to
    //              starboard locations(refrence view is from stern to bow).
    // Parameter:   KINT16 RPM, void
    //************************************
    void SetOrderedRPM( KINT16 RPM );
    KINT16 GetOrderedRPM() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Shaft::SetRateOfChange
    //              KDIS::DATA_TYPE::Shaft::GetRateOfChange
    // Description: Current speed in RPM of the shaft.
    //              A positive value indicates a clockwise
    //              rotation. Shafts are defined from port to
    //              starboard locations(refrence view is from stern to bow).
    // Parameter:   KINT32 ROC, void
    //************************************
    void SetRateOfChange( KINT32 ROC );
    KINT32 GetRateOfChange() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Shaft::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::Shaft::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::Shaft::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const Shaft & Value ) const;
    KBOOL operator != ( const Shaft & Value ) const;
}